

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O2

void send_file_data(mg_connection *conn,mg_file *filep,int64_t offset,int64_t len,int no_buffering)

{
  FILE *__stream;
  int iVar1;
  uint uVar2;
  ulong uVar3;
  ssize_t sVar4;
  int *piVar5;
  char *pcVar6;
  char *func;
  size_t sVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  char buf [8192];
  
  if (conn != (mg_connection *)0x0 && filep != (mg_file *)0x0) {
    uVar3 = (filep->stat).size;
    if ((ulong)offset <= uVar3) {
      uVar3 = offset;
    }
    uVar9 = 0xffffffff;
    if (0x7ffffffffffffffe < uVar3) {
      uVar3 = 0x7fffffffffffffff;
    }
    uVar10 = 0;
    if (-1 < offset) {
      uVar10 = uVar3;
    }
    if ((0 < len) && (__stream = (FILE *)(filep->access).fp, __stream != (FILE *)0x0)) {
      if ((conn->ssl == (SSL *)0x0) &&
         ((conn->throttle == 0 &&
          (uVar9 = 0xffffffff, iVar1 = mg_strcasecmp(conn->dom_ctx->config[8],"yes"), iVar1 == 0))))
      {
        buf._0_8_ = uVar10;
        iVar1 = fileno(__stream);
        iVar8 = 0;
        do {
          sVar7 = 0x7ffff000;
          if ((ulong)len < 0x7ffff000) {
            sVar7 = len;
          }
          sVar4 = sendfile64((conn->client).sock,iVar1,(__off64_t *)buf,sVar7);
          uVar9 = (uint)sVar7;
          uVar10 = buf._0_8_;
          if (sVar4 < 1) {
            if (iVar8 == 0) goto LAB_0010f3a1;
            if (sVar4 == 0) {
              return;
            }
          }
          else {
            len = len - sVar4;
          }
        } while ((-1 < sVar4) && (iVar8 = iVar8 + -1, 0 < len));
        if (0 < sVar4) {
          return;
        }
      }
LAB_0010f3a1:
      if (((long)uVar10 < 1) || (iVar1 = fseeko64((FILE *)(filep->access).fp,uVar10,0), iVar1 == 0))
      {
        do {
          if (len < 1) {
            return;
          }
          sVar7 = len & 0xffffffff;
          if (0x1fff < (ulong)len) {
            sVar7 = 0x2000;
          }
          sVar7 = fread(buf,1,sVar7,(FILE *)(filep->access).fp);
          uVar9 = (uint)sVar7;
          if ((int)uVar9 < 1) {
            return;
          }
          uVar2 = mg_write(conn,buf,(ulong)(uVar9 & 0x7fffffff));
          len = len - (ulong)uVar2;
        } while (uVar2 == uVar9);
      }
      else {
        piVar5 = __errno_location();
        pcVar6 = strerror(*piVar5);
        mg_cry_internal_wrap
                  (conn,(mg_context *)0x0,func,uVar9,"%s: fseeko() failed: %s","send_file_data",
                   pcVar6);
        mg_send_http_error(conn,500,"%s","Error: Unable to access file at requested position.");
      }
    }
  }
  return;
}

Assistant:

static void
send_file_data(struct mg_connection *conn,
               struct mg_file *filep,
               int64_t offset,
               int64_t len,
               int no_buffering)
{
	char buf[MG_BUF_LEN];
	int to_read, num_read, num_written;
	int64_t size;

	if (!filep || !conn) {
		return;
	}

	/* Sanity check the offset */
	size = (filep->stat.size > INT64_MAX) ? INT64_MAX
	                                      : (int64_t)(filep->stat.size);
	offset = (offset < 0) ? 0 : ((offset > size) ? size : offset);

	if (len > 0 && filep->access.fp != NULL) {
		/* file stored on disk */
#if defined(__linux__)
		/* sendfile is only available for Linux */
		if ((conn->ssl == 0) && (conn->throttle == 0)
		    && (!mg_strcasecmp(conn->dom_ctx->config[ALLOW_SENDFILE_CALL],
		                       "yes"))) {
			off_t sf_offs = (off_t)offset;
			ssize_t sf_sent;
			int sf_file = fileno(filep->access.fp);
			int loop_cnt = 0;

			do {
				/* 2147479552 (0x7FFFF000) is a limit found by experiment on
				 * 64 bit Linux (2^31 minus one memory page of 4k?). */
				size_t sf_tosend =
				    (size_t)((len < 0x7FFFF000) ? len : 0x7FFFF000);
				sf_sent =
				    sendfile(conn->client.sock, sf_file, &sf_offs, sf_tosend);
				if (sf_sent > 0) {
					len -= sf_sent;
					offset += sf_sent;
				} else if (loop_cnt == 0) {
					/* This file can not be sent using sendfile.
					 * This might be the case for pseudo-files in the
					 * /sys/ and /proc/ file system.
					 * Use the regular user mode copy code instead. */
					break;
				} else if (sf_sent == 0) {
					/* No error, but 0 bytes sent. May be EOF? */
					return;
				}
				loop_cnt++;

			} while ((len > 0) && (sf_sent >= 0));

			if (sf_sent > 0) {
				return; /* OK */
			}

			/* sf_sent<0 means error, thus fall back to the classic way */
			/* This is always the case, if sf_file is not a "normal" file,
			 * e.g., for sending data from the output of a CGI process. */
			offset = (int64_t)sf_offs;
		}
#endif
		if ((offset > 0) && (fseeko(filep->access.fp, offset, SEEK_SET) != 0)) {
			mg_cry_internal(conn,
			                "%s: fseeko() failed: %s",
			                __func__,
			                strerror(ERRNO));
			mg_send_http_error(
			    conn,
			    500,
			    "%s",
			    "Error: Unable to access file at requested position.");
		} else {
			while (len > 0) {
				/* Calculate how much to read from the file into the buffer. */
				/* If no_buffering is set, we should not wait until the
				 * CGI->Server buffer is filled, but send everything
				 * immediately. In theory buffering could be turned off using
				 * setbuf(filep->access.fp, NULL);
				 * setvbuf(filep->access.fp, NULL, _IONBF, 0);
				 * but in practice this does not work. A "Linux only" solution
				 * may be to use select(). The only portable way is to read byte
				 * by byte, but this is quite inefficient from a performance
				 * point of view. */
				to_read = no_buffering ? 1 : sizeof(buf);
				if ((int64_t)to_read > len) {
					to_read = (int)len;
				}

				/* Read from file, exit the loop on error */
				if ((num_read =
				         (int)fread(buf, 1, (size_t)to_read, filep->access.fp))
				    <= 0) {
					break;
				}

				/* Send read bytes to the client, exit the loop on error */
				if ((num_written = mg_write(conn, buf, (size_t)num_read))
				    != num_read) {
					break;
				}

				/* Both read and were successful, adjust counters */
				len -= num_written;
			}
		}
	}
}